

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void prvTidyInitMap(void)

{
  MapStr("\r\n\f",0x18);
  MapStr(" \t",8);
  MapStr("-.:_",4);
  MapStr("0123456789",0x85);
  MapStr("abcdefghijklmnopqrstuvwxyz",0x26);
  MapStr("ABCDEFGHIJKLMNOPQRSTUVWXYZ",0x46);
  MapStr("abcdefABCDEF",0x80);
  return;
}

Assistant:

void TY_(InitMap)(void)
{
    MapStr("\r\n\f", newline|white);
    MapStr(" \t", white);
    MapStr("-.:_", namechar);
    MapStr("0123456789", digit|digithex|namechar);
    MapStr("abcdefghijklmnopqrstuvwxyz", lowercase|letter|namechar);
    MapStr("ABCDEFGHIJKLMNOPQRSTUVWXYZ", uppercase|letter|namechar);
    MapStr("abcdefABCDEF", digithex);
}